

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

ssize_t mqtt_pack_publish_request
                  (uint8_t *buf,size_t bufsz,char *topic_name,uint16_t packet_id,
                  void *application_message,size_t application_message_size,uint8_t publish_flags)

{
  uint16_t integer_htons;
  size_t sVar1;
  ssize_t sVar2;
  byte bVar3;
  uint uVar4;
  ssize_t sVar5;
  ushort *__dest;
  mqtt_fixed_header fixed_header;
  mqtt_fixed_header local_3c;
  
  sVar5 = -0x7fffffff;
  if (topic_name != (char *)0x0 && buf != (uint8_t *)0x0) {
    bVar3 = publish_flags >> 1 & 3;
    local_3c.control_type = MQTT_CONTROL_PUBLISH;
    sVar1 = strlen(topic_name);
    uVar4 = (int)sVar1 + (int)application_message_size + (uint)(bVar3 != 0) * 2 + 2;
    sVar5 = -0x7ffffff6;
    if (bVar3 != 3) {
      local_3c._4_1_ = publish_flags & 7;
      local_3c.remaining_length = uVar4;
      sVar5 = mqtt_pack_fixed_header(buf,bufsz,&local_3c);
      if (0 < sVar5) {
        if (bufsz - sVar5 < (ulong)uVar4) {
          sVar5 = 0;
        }
        else {
          sVar2 = __mqtt_pack_str(buf + sVar5,topic_name);
          __dest = (ushort *)(buf + sVar5 + sVar2);
          if (bVar3 != 0) {
            *__dest = packet_id << 8 | packet_id >> 8;
            __dest = __dest + 1;
          }
          memcpy(__dest,application_message,application_message_size);
          sVar5 = (long)__dest + (application_message_size - (long)buf);
        }
      }
    }
  }
  return sVar5;
}

Assistant:

ssize_t mqtt_pack_publish_request(uint8_t *buf, size_t bufsz,
                                  const char* topic_name,
                                  uint16_t packet_id,
                                  const void* application_message,
                                  size_t application_message_size,
                                  uint8_t publish_flags)
{
    const uint8_t *const start = buf;
    ssize_t rv;
    struct mqtt_fixed_header fixed_header;
    uint32_t remaining_length;
    uint8_t inspected_qos;

    /* check for null pointers */
    if(buf == NULL || topic_name == NULL) {
        return MQTT_ERROR_NULLPTR;
    }

    /* inspect QoS level */
    inspected_qos = (publish_flags & MQTT_PUBLISH_QOS_MASK) >> 1; /* mask */

    /* build the fixed header */
    fixed_header.control_type = MQTT_CONTROL_PUBLISH;

    /* calculate remaining length */
    remaining_length = (uint32_t)__mqtt_packed_cstrlen(topic_name);
    if (inspected_qos > 0) {
        remaining_length += 2;
    }
    remaining_length += (uint32_t)application_message_size;
    fixed_header.remaining_length = remaining_length;

    /* force dup to 0 if qos is 0 [Spec MQTT-3.3.1-2] */
    if (inspected_qos == 0) {
        publish_flags &= (uint8_t)~MQTT_PUBLISH_DUP;
    }

    /* make sure that qos is not 3 [Spec MQTT-3.3.1-4] */
    if (inspected_qos == 3) {
        return MQTT_ERROR_PUBLISH_FORBIDDEN_QOS;
    }
    fixed_header.control_flags = publish_flags & 0x7;

    /* pack fixed header */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        /* something went wrong */
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    /* check that buffer is big enough */
    if (bufsz < remaining_length) {
        return 0;
    }

    /* pack variable header */
    buf += __mqtt_pack_str(buf, topic_name);
    if (inspected_qos > 0) {
        buf += __mqtt_pack_uint16(buf, packet_id);
    }

    /* pack payload */
    memcpy(buf, application_message, application_message_size);
    buf += application_message_size;

    return buf - start;
}